

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::call_nz_a16(CPU *this)

{
  uint16_t *puVar1;
  Registers *pRVar2;
  int iVar3;
  
  pRVar2 = this->regs;
  if (-1 < (char)pRVar2->f) {
    (*this->mmu->_vptr_IMmu[3])
              (this->mmu,(ulong)(pRVar2->sp - 2 & 0xffff),(ulong)(pRVar2->pc + 2 & 0xffff));
    pRVar2 = this->regs;
    puVar1 = &pRVar2->sp;
    *puVar1 = *puVar1 - 2;
    iVar3 = (*this->mmu->_vptr_IMmu[1])(this->mmu,(ulong)pRVar2->pc);
    this->regs->pc = (uint16_t)iVar3;
    return 6;
  }
  pRVar2->pc = pRVar2->pc + 2;
  return 3;
}

Assistant:

int CPU::call_nz_a16() {
    if (!(regs.f & 0x80)) {
        mmu.write_word(regs.sp - 2, regs.pc + 2);
        regs.sp -= 2;
        regs.pc = mmu.read_word(regs.pc);
        return 6;
    } else {
        regs.pc += 2;
        return 3;
    }
}